

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O3

void export_residual_table_to_string
               (double *residuals,double *header,double *left_column,uint time_steps,
               uint space_steps,char *result)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char current_experiment_to_string [131072];
  ulong uStack_20068;
  char acStack_20038 [131080];
  
  memset(acStack_20038,0,0x20000);
  if (space_steps != 0) {
    uVar2 = 0;
    do {
      snprintf(acStack_20038,0x20000,"%.6lf",header[uVar2]);
      sVar1 = strlen(result);
      strncat(result,acStack_20038,0x1ffff - sVar1);
      uVar2 = uVar2 + 1;
    } while (space_steps != uVar2);
    if (space_steps != 0) {
      uStack_20068 = 0;
      uVar2 = 0;
      do {
        snprintf(acStack_20038,0x20000,"%.6lf",left_column[uVar2]);
        sVar1 = strlen(result);
        strncat(result,acStack_20038,0x1ffff - sVar1);
        uVar3 = uStack_20068;
        uVar4 = (ulong)time_steps;
        if (time_steps != 0) {
          do {
            snprintf(acStack_20038,0x20000,"%le",residuals[uVar3]);
            sVar1 = strlen(result);
            strncat(result,acStack_20038,0x1ffff - sVar1);
            uVar4 = uVar4 - 1;
            uVar3 = (ulong)((int)uVar3 + 1);
          } while (uVar4 != 0);
        }
        sVar1 = strlen(result);
        strncat(result,acStack_20038,0x1ffff - sVar1);
        uVar2 = uVar2 + 1;
        uStack_20068 = (ulong)((int)uStack_20068 + time_steps);
      } while (uVar2 != space_steps);
    }
  }
  return;
}

Assistant:

void export_residual_table_to_string (double const * residuals, 
                            double const * header, 
                            double const * left_column,
                            unsigned const time_steps, 
                            unsigned const space_steps,
                            char * result) {
  // result is output string

  char current_experiment_to_string[MAX_BUFFER_SIZE] = "";
  unsigned time_step, space_step;

  for (space_step = 0; space_step < space_steps; ++space_step) {
    snprintf (current_experiment_to_string, 
            MAX_BUFFER_SIZE,
            "%.6lf",
            header[space_step]);
    strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);
  }

  for (space_step = 0; space_step < space_steps; ++space_step) {
    snprintf (current_experiment_to_string, 
              MAX_BUFFER_SIZE,
              "%.6lf",
              left_column[space_step]);
    strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);

    for (time_step = 0; time_step < time_steps; ++time_step) {
      snprintf (current_experiment_to_string, 
              MAX_BUFFER_SIZE,
              "%le",
              residuals[space_step * time_steps + time_step]);
      strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);
    }

    snprintf (current_experiment_to_string, 
              MAX_BUFFER_SIZE,
              "%s",
              "\n");
    strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);
  }

  return;
}